

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O1

void __thiscall testing::internal::UnitTestImpl::RegisterParameterizedTests(UnitTestImpl *this)

{
  pointer ppPVar1;
  
  if (this->parameterized_tests_registered_ == false) {
    for (ppPVar1 = (this->parameterized_test_registry_).test_case_infos_.
                   super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppPVar1 !=
        (this->parameterized_test_registry_).test_case_infos_.
        super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppPVar1 = ppPVar1 + 1) {
      (*(*ppPVar1)->_vptr_ParameterizedTestCaseInfoBase[4])();
    }
    this->parameterized_tests_registered_ = true;
  }
  return;
}

Assistant:

void UnitTestImpl::RegisterParameterizedTests() {
#if GTEST_HAS_PARAM_TEST
  if (!parameterized_tests_registered_) {
    parameterized_test_registry_.RegisterTests();
    parameterized_tests_registered_ = true;
  }
#endif
}